

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# names.cc
# Opt level: O0

string * __thiscall
google::protobuf::compiler::objectivec::(anonymous_namespace)::FragmentName_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,FieldDescriptor *field,
          FragmentNameMode mode)

{
  Type TVar1;
  char *__s;
  Descriptor *this_00;
  LogMessage *pLVar2;
  uint *b;
  Descriptor *descriptor;
  LogMessage local_d8;
  Voidify local_c3;
  byte local_c2;
  allocator<char> local_c1;
  AlphaNum local_c0;
  byte local_89;
  string local_88;
  AlphaNum local_68;
  allocator<char> local_37;
  allocator<char> local_36;
  allocator<char> local_35;
  allocator<char> local_34;
  allocator<char> local_33;
  allocator<char> local_32;
  allocator<char> local_31;
  allocator<char> local_30;
  allocator<char> local_2f;
  allocator<char> local_2e;
  allocator<char> local_2d [16];
  allocator<char> local_1d;
  int local_1c;
  FieldDescriptor *pFStack_18;
  FragmentNameMode mode_local;
  FieldDescriptor *field_local;
  
  local_1c = (int)field;
  pFStack_18 = (FieldDescriptor *)this;
  field_local = (FieldDescriptor *)__return_storage_ptr__;
  TVar1 = FieldDescriptor::type((FieldDescriptor *)this);
  b = &switchD_0172f8e9::switchdataD_01fabe2c;
  switch(TVar1) {
  case TYPE_DOUBLE:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"Double",&local_31);
    std::allocator<char>::~allocator(&local_31);
    break;
  case TYPE_FLOAT:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"Float",&local_30);
    std::allocator<char>::~allocator(&local_30);
    break;
  case TYPE_INT64:
  case TYPE_SFIXED64:
  case MAX_TYPE:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"Int64",&local_2e);
    std::allocator<char>::~allocator(&local_2e);
    break;
  case TYPE_UINT64:
  case TYPE_FIXED64:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"UInt64",&local_2f);
    std::allocator<char>::~allocator(&local_2f);
    break;
  case TYPE_INT32:
  case TYPE_SFIXED32:
  case TYPE_SINT32:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"Int32",&local_1d);
    std::allocator<char>::~allocator(&local_1d);
    break;
  case TYPE_FIXED32:
  case TYPE_UINT32:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"UInt32",local_2d);
    std::allocator<char>::~allocator(local_2d);
    break;
  case TYPE_BOOL:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"Bool",&local_32);
    std::allocator<char>::~allocator(&local_32);
    break;
  case TYPE_STRING:
    if (local_1c == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"Object",&local_33);
      std::allocator<char>::~allocator(&local_33);
      return __return_storage_ptr__;
    }
    if (local_1c == 1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"String",&local_34);
      std::allocator<char>::~allocator(&local_34);
      return __return_storage_ptr__;
    }
    if (local_1c == 2) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"NSString*",&local_35);
      std::allocator<char>::~allocator(&local_35);
      return __return_storage_ptr__;
    }
  case TYPE_BYTES:
    __s = "Object";
    if (local_1c == 2) {
      __s = "NSData*";
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,__s,&local_36);
    std::allocator<char>::~allocator(&local_36);
    break;
  case TYPE_GROUP:
  case TYPE_MESSAGE:
    local_89 = 0;
    local_c2 = 0;
    if (local_1c == 2) {
      this_00 = FieldDescriptor::message_type(pFStack_18);
      ClassName_abi_cxx11_(&local_88,(objectivec *)this_00,descriptor);
      local_89 = 1;
      absl::lts_20250127::AlphaNum::AlphaNum<std::allocator<char>>(&local_68,&local_88);
      absl::lts_20250127::AlphaNum::AlphaNum(&local_c0,"*");
      absl::lts_20250127::StrCat_abi_cxx11_
                (__return_storage_ptr__,(lts_20250127 *)&local_68,&local_c0,(AlphaNum *)b);
    }
    else {
      std::allocator<char>::allocator();
      local_c2 = 1;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"Object",&local_c1);
    }
    if ((local_c2 & 1) != 0) {
      std::allocator<char>::~allocator(&local_c1);
    }
    if ((local_89 & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_88);
    }
    break;
  case TYPE_ENUM:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"Enum",&local_37);
    std::allocator<char>::~allocator(&local_37);
    break;
  default:
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_d8,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/objectivec/names.cc"
               ,0x3b6);
    pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_d8);
    pLVar2 = absl::lts_20250127::log_internal::LogMessage::operator<<
                       (pLVar2,(char (*) [16])"Can\'t get here.");
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_c3,pLVar2);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_d8);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string FragmentName(const FieldDescriptor* field,
                         FragmentNameMode mode = FragmentNameMode::kCommon) {
  switch (field->type()) {
    case FieldDescriptor::TYPE_INT32:
    case FieldDescriptor::TYPE_SINT32:
    case FieldDescriptor::TYPE_SFIXED32:
      return "Int32";

    case FieldDescriptor::TYPE_UINT32:
    case FieldDescriptor::TYPE_FIXED32:
      return "UInt32";

    case FieldDescriptor::TYPE_INT64:
    case FieldDescriptor::TYPE_SINT64:
    case FieldDescriptor::TYPE_SFIXED64:
      return "Int64";

    case FieldDescriptor::TYPE_UINT64:
    case FieldDescriptor::TYPE_FIXED64:
      return "UInt64";

    case FieldDescriptor::TYPE_FLOAT:
      return "Float";

    case FieldDescriptor::TYPE_DOUBLE:
      return "Double";

    case FieldDescriptor::TYPE_BOOL:
      return "Bool";

    case FieldDescriptor::TYPE_STRING: {
      switch (mode) {
        case FragmentNameMode::kCommon:
          return "Object";
        case FragmentNameMode::kMapKey:
          return "String";
        case FragmentNameMode::kObjCGenerics:
          return "NSString*";
      }
    }

    case FieldDescriptor::TYPE_BYTES:
      return (mode == FragmentNameMode::kObjCGenerics ? "NSData*" : "Object");

    case FieldDescriptor::TYPE_ENUM:
      return "Enum";

    case FieldDescriptor::TYPE_GROUP:
    case FieldDescriptor::TYPE_MESSAGE:
      return (mode == FragmentNameMode::kObjCGenerics
                  ? absl::StrCat(ClassName(field->message_type()), "*")
                  : "Object");
  }

  // Some compilers report reaching end of function even though all cases of
  // the enum are handed in the switch.
  ABSL_LOG(FATAL) << "Can't get here.";
}